

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

void setupGenerator(Generator *g,int mc,uint32_t flags)

{
  Layer *pLVar1;
  undefined1 uVar2;
  
  g->mc = mc;
  g->dim = 1000;
  g->flags = flags;
  g->seed = 0;
  g->sha = 0;
  if (mc - 2U < 0x14) {
    setupLayerStack(&(g->field_5).field_0.ls,mc,flags & 1);
    (g->field_5).field_0.entry = (Layer *)0x0;
    if (0xf < mc && (flags & 4) != 0) {
      (g->field_5).field_0.xlayer[2].getMap = mapOceanMixMod;
      uVar2 = (undefined1)mc;
      *(undefined1 *)((long)&g->field_5 + 0x1328) = uVar2;
      *(undefined2 *)((long)&g->field_5 + 0x1329) = 1;
      *(undefined8 *)&(g->field_5).field_0.xlayer[2].scale = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[2].layerSalt + 4) = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[2].startSalt + 4) = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[2].startSeed + 4) = 0;
      (g->field_5).field_0.xlayer[2].noise = (void *)0x0;
      (g->field_5).field_0.xlayer[2].data = (void *)0x0;
      pLVar1 = (g->field_5).field_0.ls.entry_64;
      (g->field_5).field_0.xlayer[2].p = (g->field_5).field_0.ls.entry_16;
      (g->field_5).field_0.xlayer[2].p2 = (Layer *)((long)&g->field_5 + 0xea0);
      (g->field_5).field_0.ls.entry_16 = (Layer *)((long)&g->field_5 + 0x1320);
      (g->field_5).field_0.xlayer[3].getMap = mapOceanMixMod;
      *(undefined1 *)((long)&g->field_5 + 0x1370) = uVar2;
      *(undefined2 *)((long)&g->field_5 + 0x1371) = 1;
      *(undefined8 *)&(g->field_5).field_0.xlayer[3].scale = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[3].layerSalt + 4) = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[3].startSalt + 4) = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[3].startSeed + 4) = 0;
      (g->field_5).field_0.xlayer[3].noise = (void *)0x0;
      (g->field_5).field_0.xlayer[3].data = (void *)0x0;
      (g->field_5).field_0.xlayer[3].p = pLVar1;
      (g->field_5).field_0.xlayer[3].p2 = (Layer *)((long)&g->field_5 + 0xe10);
      (g->field_5).field_0.ls.entry_64 = (Layer *)((long)&g->field_5 + 0x1368);
      pLVar1 = (g->field_5).field_0.ls.entry_256;
      (g->field_5).field_0.xlayer[4].getMap = mapOceanMixMod;
      *(undefined1 *)((long)&g->field_5 + 0x13b8) = uVar2;
      *(undefined2 *)((long)&g->field_5 + 0x13b9) = 1;
      (g->field_5).field_0.xlayer[4].noise = (void *)0x0;
      (g->field_5).field_0.xlayer[4].data = (void *)0x0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[4].startSalt + 4) = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[4].startSeed + 4) = 0;
      *(undefined8 *)&(g->field_5).field_0.xlayer[4].scale = 0;
      *(undefined8 *)((long)&(g->field_5).field_0.xlayer[4].layerSalt + 4) = 0;
      (g->field_5).field_0.xlayer[4].p = pLVar1;
      (g->field_5).field_0.xlayer[4].p2 = (Layer *)((long)&g->field_5 + 0xd80);
      (g->field_5).field_0.ls.entry_256 = (Layer *)((long)&g->field_5 + 0x13b0);
    }
  }
  else {
    if (0x15 < mc) {
      initBiomeNoise((BiomeNoise *)&(g->field_5).field_0,mc);
      return;
    }
    (g->field_5).field_2.bnb.mc = mc;
  }
  return;
}

Assistant:

void setupGenerator(Generator *g, int mc, uint32_t flags)
{
    g->mc = mc;
    g->dim = DIM_UNDEF;
    g->flags = flags;
    g->seed = 0;
    g->sha = 0;

    if (mc >= MC_B1_8 && mc <= MC_1_17)
    {
        setupLayerStack(&g->ls, mc, flags & LARGE_BIOMES);
        g->entry = NULL;
        if (flags & FORCE_OCEAN_VARIANTS && mc >= MC_1_13)
        {
            g->ls.entry_16 = setupLayer(
                g->xlayer+2, &mapOceanMixMod, mc, 1, 0, 0,
                g->ls.entry_16, &g->ls.layers[L_ZOOM_16_OCEAN]);

            g->ls.entry_64 = setupLayer(
                g->xlayer+3, &mapOceanMixMod, mc, 1, 0, 0,
                g->ls.entry_64, &g->ls.layers[L_ZOOM_64_OCEAN]);

            g->ls.entry_256 = setupLayer(
                g->xlayer+4, &mapOceanMixMod, mc, 1, 0, 0,
                g->ls.entry_256, &g->ls.layers[L_OCEAN_TEMP_256]);
        }
    }
    else if (mc >= MC_1_18)
    {
        initBiomeNoise(&g->bn, mc);
    }
    else
    {
        g->bnb.mc = mc;
    }
}